

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPHelperTests.cpp
# Opt level: O0

void __thiscall
OpenMPHelperTest_OpenMPDisabled_Test::TestBody(OpenMPHelperTest_OpenMPDisabled_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  type *in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar3;
  char *in_stack_ffffffffffffff38;
  int line;
  char *in_stack_ffffffffffffff40;
  AssertionResult *this_02;
  Type in_stack_ffffffffffffff4c;
  Type type;
  AssertHelper *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar4;
  AssertHelper *in_stack_ffffffffffffff80;
  AssertionResult local_58;
  uint local_44;
  int local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  bVar1 = pica::useOpenMP();
  if (!bVar1) {
    local_1c = 1;
    local_20 = omp_get_max_threads();
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_ffffffffffffff38,
               (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff50 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x2281d7);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
                 (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff80,
                 (Message *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
      testing::Message::~Message((Message *)0x228234);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2282a2);
    if (local_44 == 0) {
      omp_get_thread_num();
      this_02 = &local_58;
      testing::internal::EqHelper<true>::Compare<int,int>
                (in_stack_ffffffffffffff38,
                 (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
      type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff50);
        in_stack_ffffffffffffff38 =
             testing::AssertionResult::failure_message((AssertionResult *)0x228366);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff50,type,&this_02->success_,
                   (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                   (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff80,
                   (Message *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
        testing::Message::~Message((Message *)0x2283ba);
      }
      local_44 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x228425);
      if (local_44 == 0) {
        uVar4 = 1;
        iVar2 = omp_get_num_threads();
        this_01 = (AssertionResult *)&stack0xffffffffffffff80;
        testing::internal::EqHelper<false>::Compare<int,int>
                  (in_stack_ffffffffffffff38,
                   (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                   (int *)this_01,(int *)in_stack_ffffffffffffff20);
        line = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
        if (!bVar1) {
          uVar3 = bVar1;
          testing::Message::Message((Message *)in_stack_ffffffffffffff50);
          this_00 = (AssertHelper *)
                    testing::AssertionResult::failure_message((AssertionResult *)0x2284cf);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_ffffffffffffff50,type,&this_02->success_,line,
                     (char *)CONCAT17(uVar3,in_stack_ffffffffffffff30));
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff80,(Message *)CONCAT44(uVar4,iVar2));
          testing::internal::AssertHelper::~AssertHelper(this_00);
          testing::Message::~Message((Message *)0x22851d);
        }
        local_44 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x22857f);
      }
    }
  }
  return;
}

Assistant:

TEST(OpenMPHelperTest, OpenMPDisabled) {
    if (!useOpenMP()) {
        ASSERT_EQ(1, omp_get_max_threads());
        ASSERT_EQ(0, omp_get_thread_num());
        ASSERT_EQ(1, omp_get_num_threads());
    }
}